

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantPool.cc
# Opt level: O2

void __thiscall flow::ConstantPool::dump(ConstantPool *this)

{
  pointer ppVar1;
  pointer pbVar2;
  pointer pbVar3;
  pointer plVar4;
  pointer plVar5;
  pointer pIVar6;
  pointer pIVar7;
  pointer pCVar8;
  pointer pCVar9;
  pointer pRVar10;
  pointer pRVar11;
  pointer pvVar12;
  pointer pMVar13;
  pointer pMVar14;
  pointer ppVar15;
  pointer pcVar16;
  Instruction *program;
  flow *this_00;
  pointer puVar17;
  char *pcVar18;
  ostream *poVar19;
  long extraout_RDX;
  long extraout_RDX_00;
  long lVar20;
  size_t sVar21;
  char *__format;
  _Alloc_hider in_R9;
  long lVar22;
  long lVar23;
  long lVar24;
  pointer ppVar25;
  bool bVar26;
  allocator<char> local_89;
  size_t local_88;
  size_t local_80;
  string local_78;
  size_t local_58;
  string local_50 [32];
  
  puts("; Program");
  if ((this->modules_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->modules_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puts("\n; Modules");
    lVar20 = (long)(this->modules_).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->modules_).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 6;
    lVar22 = 0;
    while (bVar26 = lVar20 != 0, lVar20 = lVar20 + -1, bVar26) {
      ppVar1 = (this->modules_).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(long *)((long)&(ppVar1->second)._M_string_length + lVar22) == 0) {
        printf(".module \'%s\'\n",*(undefined8 *)((long)&(ppVar1->first)._M_dataplus._M_p + lVar22))
        ;
      }
      else {
        printf(".module \'%s\' from \'%s\'\n",
               *(undefined8 *)((long)&(ppVar1->first)._M_dataplus._M_p + lVar22),
               *(undefined8 *)((long)&(ppVar1->second)._M_dataplus._M_p + lVar22));
      }
      lVar22 = lVar22 + 0x40;
    }
  }
  if ((this->nativeFunctionSignatures_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->nativeFunctionSignatures_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puts("\n; External Functions");
    pbVar2 = (this->nativeFunctionSignatures_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar3 = (this->nativeFunctionSignatures_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar20 = 0;
    for (lVar22 = 0; (long)pbVar2 - (long)pbVar3 >> 5 != lVar22; lVar22 = lVar22 + 1) {
      printf(".extern function %3zu = %-20s\n",lVar22,
             *(undefined8 *)
              ((long)&(((this->nativeFunctionSignatures_).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar20));
      lVar20 = lVar20 + 0x20;
    }
  }
  if ((this->nativeHandlerSignatures_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->nativeHandlerSignatures_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puts("\n; External Handlers");
    pbVar2 = (this->nativeHandlerSignatures_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar3 = (this->nativeHandlerSignatures_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar20 = 0;
    for (lVar22 = 0; (long)pbVar2 - (long)pbVar3 >> 5 != lVar22; lVar22 = lVar22 + 1) {
      printf(".extern handler %4zu = %-20s\n",lVar22,
             *(undefined8 *)
              ((long)&(((this->nativeHandlerSignatures_).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar20));
      lVar20 = lVar20 + 0x20;
    }
  }
  if ((this->numbers_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->numbers_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puts("\n; Integer Constants");
    plVar4 = (this->numbers_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    plVar5 = (this->numbers_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar20 = 0; (long)plVar4 - (long)plVar5 >> 3 != lVar20; lVar20 = lVar20 + 1) {
      printf(".const integer %5zu = %li\n",lVar20,
             (this->numbers_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start[lVar20]);
    }
  }
  if ((this->strings_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->strings_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puts("\n; String Constants");
    pbVar2 = (this->strings_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar3 = (this->strings_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar20 = 0;
    for (lVar22 = 0; (long)pbVar2 - (long)pbVar3 >> 5 != lVar22; lVar22 = lVar22 + 1) {
      printf(".const string %6zu = \'%s\'\n",lVar22,
             *(undefined8 *)
              ((long)&(((this->strings_).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar20));
      lVar20 = lVar20 + 0x20;
    }
  }
  if ((this->ipaddrs_).
      super__Vector_base<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->ipaddrs_).
      super__Vector_base<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puts("\n; IP Constants");
    pIVar6 = (this->ipaddrs_).
             super__Vector_base<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pIVar7 = (this->ipaddrs_).
             super__Vector_base<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar20 = 0;
    for (lVar22 = 0; ((long)pIVar6 - (long)pIVar7) / 0x44 != lVar22; lVar22 = lVar22 + 1) {
      util::IPAddress::str_abi_cxx11_
                (&local_78,
                 (IPAddress *)
                 (((this->ipaddrs_).
                   super__Vector_base<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>
                   ._M_impl.super__Vector_impl_data._M_start)->cstr_ + lVar20 + -4));
      printf(".const ipaddr %6zu = %s\n",lVar22,local_78._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_78);
      lVar20 = lVar20 + 0x44;
    }
  }
  if ((this->cidrs_).super__Vector_base<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>._M_impl
      .super__Vector_impl_data._M_start !=
      (this->cidrs_).super__Vector_base<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    puts("\n; CIDR Constants");
    pCVar8 = (this->cidrs_).super__Vector_base<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pCVar9 = (this->cidrs_).super__Vector_base<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar20 = 0;
    for (lVar22 = 0; ((long)pCVar8 - (long)pCVar9) / 0x50 != lVar22; lVar22 = lVar22 + 1) {
      util::Cidr::str_abi_cxx11_
                (&local_78,
                 (Cidr *)((((this->cidrs_).
                            super__Vector_base<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>.
                            _M_impl.super__Vector_impl_data._M_start)->ipaddr_).cstr_ + lVar20 + -4)
                );
      printf(".const cidr %8zu = %s\n",lVar22,local_78._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_78);
      lVar20 = lVar20 + 0x50;
    }
  }
  if ((this->regularExpressions_).
      super__Vector_base<flow::util::RegExp,_std::allocator<flow::util::RegExp>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->regularExpressions_).
      super__Vector_base<flow::util::RegExp,_std::allocator<flow::util::RegExp>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puts("\n; Regular Expression Constants");
    pRVar10 = (this->regularExpressions_).
              super__Vector_base<flow::util::RegExp,_std::allocator<flow::util::RegExp>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pRVar11 = (this->regularExpressions_).
              super__Vector_base<flow::util::RegExp,_std::allocator<flow::util::RegExp>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar20 = 0;
    for (lVar22 = 0; (long)pRVar10 - (long)pRVar11 >> 6 != lVar22; lVar22 = lVar22 + 1) {
      pcVar18 = util::RegExp::c_str((RegExp *)
                                    ((long)&(((this->regularExpressions_).
                                              super__Vector_base<flow::util::RegExp,_std::allocator<flow::util::RegExp>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->pattern_).
                                            _M_dataplus._M_p + lVar20));
      printf(".const regex %7zu = /%s/\n",lVar22,pcVar18);
      lVar20 = lVar20 + 0x40;
    }
  }
  if ((this->stringArrays_).
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->stringArrays_).
      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::operator<<((ostream *)&std::cout,"\n; Constant String Arrays\n");
    local_88 = ((long)(this->stringArrays_).
                      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->stringArrays_).
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x18;
    sVar21 = 0;
    while (sVar21 != local_88) {
      pvVar12 = (this->stringArrays_).
                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      poVar19 = std::operator<<((ostream *)&std::cout,".const array<string> ");
      *(undefined8 *)(poVar19 + *(long *)(*(long *)poVar19 + -0x18) + 0x10) = 3;
      local_80 = sVar21;
      poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
      std::operator<<(poVar19," = [");
      pbVar2 = *(pointer *)
                ((long)&pvVar12[sVar21].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data + 8);
      lVar20 = *(long *)&pvVar12[sVar21].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data;
      lVar22 = 0;
      for (lVar23 = 0; (long)pbVar2 - lVar20 >> 5 != lVar23; lVar23 = lVar23 + 1) {
        if (lVar23 != 0) {
          std::operator<<((ostream *)&std::cout,", ");
        }
        poVar19 = std::operator<<((ostream *)&std::cout,'\"');
        poVar19 = std::operator<<(poVar19,(string *)
                                          (*(long *)&pvVar12[sVar21].
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data + lVar22));
        std::operator<<(poVar19,'\"');
        lVar22 = lVar22 + 0x20;
      }
      std::operator<<((ostream *)&std::cout,"];\n");
      sVar21 = local_80 + 1;
    }
  }
  dumpArrays<long>(&this->intArrays_,"Integer");
  dumpArrays<flow::util::IPAddress>(&this->ipaddrArrays_,"IPAddress");
  dumpArrays<flow::util::Cidr>(&this->cidrArrays_,"Cidr");
  if ((this->matchDefs_).super__Vector_base<flow::MatchDef,_std::allocator<flow::MatchDef>_>._M_impl
      .super__Vector_impl_data._M_start !=
      (this->matchDefs_).super__Vector_base<flow::MatchDef,_std::allocator<flow::MatchDef>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    puts("\n; Match Table");
    lVar20 = (long)(this->matchDefs_).
                   super__Vector_base<flow::MatchDef,_std::allocator<flow::MatchDef>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->matchDefs_).
                   super__Vector_base<flow::MatchDef,_std::allocator<flow::MatchDef>_>._M_impl.
                   super__Vector_impl_data._M_start;
    local_58 = lVar20 / 0x30;
    lVar20 = lVar20 % 0x30;
    sVar21 = 0;
    while (sVar21 != local_58) {
      pMVar13 = (this->matchDefs_).
                super__Vector_base<flow::MatchDef,_std::allocator<flow::MatchDef>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_88 = pMVar13[sVar21].handlerId;
      tos_abi_cxx11_(&local_78,(flow *)(ulong)pMVar13[sVar21].op,(MatchClass)lVar20);
      in_R9._M_p = (this->handlers_).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[pMVar13[sVar21].handlerId].first.
                   _M_dataplus._M_p;
      local_80 = sVar21;
      printf(".const match %7zu = handler %zu, op %s, elsePC %lu ; %s\n",sVar21,local_88,
             local_78._M_dataplus._M_p,pMVar13[sVar21].elsePC);
      std::__cxx11::string::~string((string *)&local_78);
      pMVar14 = *(pointer *)
                 ((long)&pMVar13[sVar21].cases.
                         super__Vector_base<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_>
                         ._M_impl + 8);
      lVar22 = *(long *)&pMVar13[sVar21].cases.
                         super__Vector_base<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_>
                         ._M_impl.super__Vector_impl_data;
      lVar23 = 0;
      lVar20 = extraout_RDX;
      for (lVar24 = 0; (long)pMVar14 - lVar22 >> 4 != lVar24; lVar24 = lVar24 + 1) {
        lVar20 = *(long *)&pMVar13[sVar21].cases.
                           super__Vector_base<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_>
                           ._M_impl.super__Vector_impl_data;
        printf("                       case %3zu = label %2lu, pc %4lu ; ",lVar24,
               *(undefined8 *)(lVar20 + lVar23),*(undefined8 *)(lVar20 + 8 + lVar23));
        if (pMVar13[sVar21].op == RegExp) {
          pcVar18 = util::RegExp::c_str((this->regularExpressions_).
                                        super__Vector_base<flow::util::RegExp,_std::allocator<flow::util::RegExp>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                        *(long *)(lVar20 + lVar23));
          __format = "/%s/\n";
        }
        else {
          pcVar18 = (this->strings_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[*(long *)(lVar20 + lVar23)].
                    _M_dataplus._M_p;
          __format = "\'%s\'\n";
        }
        printf(__format,pcVar18);
        lVar23 = lVar23 + 0x10;
        lVar20 = extraout_RDX_00;
      }
      sVar21 = local_80 + 1;
    }
  }
  ppVar15 = (this->handlers_).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar25 = (this->handlers_).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar25 != ppVar15;
      ppVar25 = ppVar25 + 1) {
    pcVar16 = (ppVar25->first)._M_dataplus._M_p;
    program = (ppVar25->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    sVar21 = computeStackSize(program,(long)(ppVar25->second).
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)program >> 3);
    printf("\n.handler %-27s ; (%zu stack size, %zu instructions)\n",pcVar16,sVar21,
           (long)(ppVar25->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(ppVar25->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3);
    this_00 = (flow *)(ppVar25->second).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
    puVar17 = (ppVar25->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::string::string<std::allocator<char>>(local_50,"  ",&local_89);
    disassemble(&local_78,this_00,(Instruction *)((long)puVar17 - (long)this_00 >> 3),
                (size_t)local_50,(string *)this,(ConstantPool *)in_R9._M_p);
    printf("%s",local_78._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string(local_50);
  }
  puts("\n");
  return;
}

Assistant:

void ConstantPool::dump() const {
  printf("; Program\n");

  if (!modules_.empty()) {
    printf("\n; Modules\n");
    for (size_t i = 0, e = modules_.size(); i != e; ++i) {
      if (modules_[i].second.empty())
        printf(".module '%s'\n", modules_[i].first.c_str());
      else
        printf(".module '%s' from '%s'\n", modules_[i].first.c_str(),
               modules_[i].second.c_str());
    }
  }

  if (!nativeFunctionSignatures_.empty()) {
    printf("\n; External Functions\n");
    for (size_t i = 0, e = nativeFunctionSignatures_.size(); i != e; ++i) {
      printf(".extern function %3zu = %-20s\n", i,
             nativeFunctionSignatures_[i].c_str());
    }
  }

  if (!nativeHandlerSignatures_.empty()) {
    printf("\n; External Handlers\n");
    for (size_t i = 0, e = nativeHandlerSignatures_.size(); i != e; ++i) {
      printf(".extern handler %4zu = %-20s\n", i,
             nativeHandlerSignatures_[i].c_str());
    }
  }

  if (!numbers_.empty()) {
    printf("\n; Integer Constants\n");
    for (size_t i = 0, e = numbers_.size(); i != e; ++i) {
      printf(".const integer %5zu = %" PRIi64 "\n", i, (FlowNumber)numbers_[i]);
    }
  }

  if (!strings_.empty()) {
    printf("\n; String Constants\n");
    for (size_t i = 0, e = strings_.size(); i != e; ++i) {
      printf(".const string %6zu = '%s'\n", i, strings_[i].c_str());
    }
  }

  if (!ipaddrs_.empty()) {
    printf("\n; IP Constants\n");
    for (size_t i = 0, e = ipaddrs_.size(); i != e; ++i) {
      printf(".const ipaddr %6zu = %s\n", i, ipaddrs_[i].str().c_str());
    }
  }

  if (!cidrs_.empty()) {
    printf("\n; CIDR Constants\n");
    for (size_t i = 0, e = cidrs_.size(); i != e; ++i) {
      printf(".const cidr %8zu = %s\n", i, cidrs_[i].str().c_str());
    }
  }

  if (!regularExpressions_.empty()) {
    printf("\n; Regular Expression Constants\n");
    for (size_t i = 0, e = regularExpressions_.size(); i != e; ++i) {
      printf(".const regex %7zu = /%s/\n", i, regularExpressions_[i].c_str());
    }
  }

  if (!stringArrays_.empty()) {
    std::cout << "\n; Constant String Arrays\n";
    for (size_t i = 0, e = stringArrays_.size(); i != e; ++i) {
      const std::vector<std::string>& array = stringArrays_[i];
      std::cout << ".const array<string> " << std::setw(3) << i << " = [";
      for (size_t k = 0, m = array.size(); k != m; ++k) {
        if (k) std::cout << ", ";
        std::cout << '"' << array[k] << '"';
      }
      std::cout << "];\n";
    }
  }

  dumpArrays(intArrays_, "Integer");
  dumpArrays(ipaddrArrays_, "IPAddress");
  dumpArrays(cidrArrays_, "Cidr");

  if (!matchDefs_.empty()) { // {{{
    printf("\n; Match Table\n");
    for (size_t i = 0, e = matchDefs_.size(); i != e; ++i) {
      const MatchDef& def = matchDefs_[i];
      printf(".const match %7zu = handler %zu, op %s, elsePC %" PRIu64
             " ; %s\n",
             i, def.handlerId, tos(def.op).c_str(), def.elsePC,
             handlers_[def.handlerId].first.c_str());

      for (size_t k = 0, m = def.cases.size(); k != m; ++k) {
        const MatchCaseDef& one = def.cases[k];

        printf("                       case %3zu = label %2" PRIu64
               ", pc %4" PRIu64 " ; ",
               k, one.label, one.pc);

        if (def.op == MatchClass::RegExp) {
          printf("/%s/\n", regularExpressions_[one.label].c_str());
        } else {
          printf("'%s'\n", strings_[one.label].c_str());
        }
      }
    }
  } // }}}

  for (const auto& handler: getHandlers()) {
    const auto& name = handler.first;
    const auto& code = handler.second;

    printf("\n.handler %-27s ; (%zu stack size, %zu instructions)\n",
           name.c_str(),
           computeStackSize(code.data(), code.size()),
           code.size());
    printf("%s", disassemble(code.data(), code.size(), "  ", this).c_str());
  }

  printf("\n\n");
}